

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update)

{
  ptls_early_data_acceptance_t pVar1;
  ulong *puVar2;
  ptls_buffer_t *ppVar3;
  FILE *__stream;
  uint __i;
  int __fd;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ptls_t *tls;
  long lVar10;
  ssize_t sVar11;
  int *piVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  uint local_4270;
  int local_4264;
  size_t local_4248;
  size_t leftlen;
  ptls_buffer_t encbuf;
  ptls_buffer_t ptbuf;
  ptls_buffer_t local_41e8;
  timeval timeout;
  fd_set exceptfds;
  fd_set readfds;
  fd_set writefds;
  char bytebuf [16384];
  
  tls = ptls_new(ctx,(uint)(server_name == (char *)0x0));
  local_41e8.base = "";
  local_41e8.is_allocated = 0;
  local_41e8.capacity = 0;
  local_41e8.off = 0;
  encbuf.base = "";
  encbuf.capacity = 0;
  encbuf.off = 0;
  encbuf.is_allocated = 0;
  ptbuf.base = "";
  ptbuf.capacity = 0;
  ptbuf.off = 0;
  ptbuf.is_allocated = 0;
  local_4270 = 0;
  fcntl(sockfd,4,0x800);
  uVar8 = 1;
  __fd = 0;
  if ((input_file == (char *)0x0) || (__fd = open(input_file,0), __stream = _stderr, __fd != -1)) {
    if (server_name != (char *)0x0) {
      ptls_set_server_name(tls,server_name,0);
      uVar4 = ptls_handshake(tls,&encbuf,(void *)0x0,(size_t *)0x0,hsprop);
      local_4270 = 0x202;
      if (uVar4 != 0x202) {
        fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar4);
        goto LAB_001070a1;
      }
    }
    iVar5 = sockfd / 0x40;
    uVar15 = 1L << ((byte)sockfd & 0x3f);
    local_4248 = 0;
    local_4264 = 0;
    do {
      iVar6 = __fd / 0x40;
      uVar17 = 1L << ((byte)__fd & 0x3f);
      iVar9 = sockfd;
      if (sockfd < __fd) {
        iVar9 = __fd;
      }
      lVar10 = 0;
      do {
        for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
          readfds.fds_bits[lVar10] = 0;
        }
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
          writefds.fds_bits[lVar10] = 0;
        }
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
          exceptfds.fds_bits[lVar10] = 0;
        }
        readfds.fds_bits[iVar5] = readfds.fds_bits[iVar5] | uVar15;
        if (encbuf.off != 0) {
          writefds.fds_bits[iVar5] = writefds.fds_bits[iVar5] | uVar15;
        }
        exceptfds.fds_bits[iVar5] = exceptfds.fds_bits[iVar5] | uVar15;
        iVar7 = sockfd;
        if (__fd != -1) {
          readfds.fds_bits[iVar6] = readfds.fds_bits[iVar6] | uVar17;
          exceptfds.fds_bits[iVar6] = exceptfds.fds_bits[iVar6] | uVar17;
          iVar7 = iVar9;
        }
        timeout.tv_sec = 0;
        if (encbuf.off == 0) {
          timeout.tv_sec = 0xe10;
        }
        timeout.tv_usec = 0;
        iVar7 = select(iVar7 + 1,(fd_set *)&readfds,(fd_set *)&writefds,(fd_set *)&exceptfds,
                       (timeval *)&timeout);
        lVar10 = 0;
      } while (iVar7 == -1);
      if (((readfds.fds_bits[iVar5] & uVar15) != 0) || ((exceptfds.fds_bits[iVar5] & uVar15) != 0))
      {
        do {
          sVar11 = read(sockfd,bytebuf,0x4000);
          if (sVar11 != -1) {
            if (sVar11 < 1) goto LAB_00107098;
            goto LAB_00106d64;
          }
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        if (*piVar12 != 0xb) goto LAB_00107098;
        sVar11 = 0;
LAB_00106d64:
        uVar14 = (ulong)local_4270;
        lVar10 = 0;
        while( true ) {
          local_4270 = (uint)uVar14;
          leftlen = sVar11 - lVar10;
          if (leftlen == 0) break;
          if (local_4264 == 0) {
            uVar8 = ptls_handshake(tls,&encbuf,bytebuf + lVar10,&leftlen,hsprop);
            uVar14 = (ulong)uVar8;
            if (uVar8 != 0x202) {
              if (uVar8 == 0) {
                iVar9 = ptls_is_server(tls);
                pVar1 = (hsprop->field_0).client.early_data_acceptance;
                if (iVar9 == 0 && pVar1 == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN) {
                  __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/cli.c"
                                ,0x8a,
                                "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int)"
                               );
                }
                if (pVar1 == PTLS_EARLY_DATA_ACCEPTED) {
                  shift_buffer(&ptbuf,local_4248);
                }
                if (request_key_update != 0) {
                  ptls_update_key(tls,1);
                }
                if (ptbuf.off == 0) {
                  uVar14 = 0;
                  local_4264 = 1;
                  goto LAB_00106ea3;
                }
                uVar8 = ptls_send(tls,&encbuf,ptbuf.base,ptbuf.off);
                ppVar3 = &ptbuf;
                local_4264 = 1;
                if (uVar8 == 0) goto LAB_00106e88;
                pcVar16 = "ptls_send(1rtt):%d\n";
                uVar14 = (ulong)uVar8;
              }
              else {
                if (encbuf.off != 0) {
                  write(sockfd,encbuf.base,encbuf.off);
                }
                uVar14 = (ulong)uVar8;
                pcVar16 = "ptls_handshake:%d\n";
              }
LAB_001071a3:
              local_4270 = (uint)uVar14;
              fprintf(_stderr,pcVar16,uVar14);
              goto LAB_00107098;
            }
            local_4264 = 0;
          }
          else {
            uVar8 = ptls_receive(tls,&local_41e8,bytebuf + lVar10,&leftlen);
            uVar14 = (ulong)uVar8;
            if (uVar8 != 0x202) {
              if (uVar8 != 0) {
                pcVar16 = "ptls_receive:%d\n";
                goto LAB_001071a3;
              }
              if (local_41e8.off != 0) {
                write(1,local_41e8.base,local_41e8.off);
                ppVar3 = &local_41e8;
LAB_00106e88:
                ppVar3->off = 0;
              }
              uVar14 = 0;
            }
          }
LAB_00106ea3:
          lVar10 = lVar10 + leftlen;
        }
      }
      if (__fd == -1) {
        __fd = -1;
      }
      else if (((readfds.fds_bits[iVar6] & uVar17) != 0) ||
              ((exceptfds.fds_bits[iVar6] & uVar17) != 0)) {
        do {
          sVar13 = read(__fd,bytebuf,0x4000);
          if (sVar13 != 0xffffffffffffffff) {
            if (0 < (long)sVar13) {
              local_4270 = ptls_buffer__do_pushv(&ptbuf,bytebuf,sVar13);
              if (local_4270 != 0) goto LAB_00107098;
              if (local_4264 == 0) {
                if (server_name != (char *)0x0) {
                  local_4270 = 0;
                  puVar2 = (hsprop->field_0).client.max_early_data_size;
                  if (puVar2 != (ulong *)0x0) {
                    uVar17 = *puVar2;
                    sVar13 = ptbuf.off;
                    if (uVar17 < ptbuf.off) {
                      sVar13 = uVar17;
                    }
                    if ((sVar13 - local_4248 != 0) &&
                       (uVar8 = ptls_send(tls,&encbuf,ptbuf.base,sVar13 - local_4248),
                       local_4248 = sVar13, uVar8 != 0)) {
                      pcVar16 = "ptls_send(early_data):%d\n";
                      goto LAB_001071ec;
                    }
                  }
                  goto LAB_00106f97;
                }
              }
              else {
                uVar8 = ptls_send(tls,&encbuf,bytebuf,sVar13);
                if (uVar8 != 0) {
                  pcVar16 = "ptls_send(1rtt):%d\n";
LAB_001071ec:
                  fprintf(_stderr,pcVar16,(ulong)uVar8);
                  local_4270 = 1;
                  goto LAB_00107098;
                }
                ptbuf.off = 0;
              }
              local_4270 = 0;
              goto LAB_00106f97;
            }
            break;
          }
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        if (input_file != (char *)0x0) {
          close(__fd);
        }
        __fd = -1;
      }
LAB_00106f97:
      if (encbuf.off != 0) {
        do {
          sVar13 = write(sockfd,encbuf.base,encbuf.off);
          if (sVar13 != 0xffffffffffffffff) {
            if ((long)sVar13 < 1) goto LAB_00107098;
            shift_buffer(&encbuf,sVar13);
            goto LAB_00106fe3;
          }
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
        if (*piVar12 != 0xb) goto LAB_00107098;
      }
LAB_00106fe3:
      if (__fd == -1 && local_4264 == 1) {
        shutdown(sockfd,1);
        local_4264 = 2;
      }
    } while( true );
  }
  piVar12 = __errno_location();
  pcVar16 = strerror(*piVar12);
  fprintf(__stream,"failed to open file:%s:%s\n",input_file,pcVar16);
  __fd = -1;
LAB_001070a1:
  if (sockfd != -1) {
    close(sockfd);
  }
  if (__fd != -1 && input_file != (char *)0x0) {
    close(__fd);
  }
  ptls_buffer_dispose(&local_41e8);
  ptls_buffer_dispose(&encbuf);
  ptls_buffer_dispose(&ptbuf);
  ptls_free(tls);
  return uVar8;
LAB_00107098:
  uVar8 = (uint)(local_4270 != 0);
  goto LAB_001070a1;
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update)
{
    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    char bytebuf[16384];
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    ssize_t ioret;

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd != -1) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                        if (ptbuf.off != 0) {
                            if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                                fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                                goto Exit;
                            }
                            ptbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* read input (and send if possible) */
        if (inputfd != -1 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
            while ((ioret = read(inputfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret > 0) {
                ptls_buffer_pushv(&ptbuf, bytebuf, ioret);
                if (state == IN_HANDSHAKE) {
                    size_t send_amount = 0;
                    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                        size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                        if (max_can_be_sent > ptbuf.off)
                            max_can_be_sent = ptbuf.off;
                        send_amount = max_can_be_sent - early_bytes_sent;
                    }
                    if (send_amount != 0) {
                        if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                            fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                            goto Exit;
                        }
                        early_bytes_sent += send_amount;
                    }
                } else {
                    if ((ret = ptls_send(tls, &encbuf, bytebuf, ioret)) != 0) {
                        fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                        goto Exit;
                    }
                    ptbuf.off = 0;
                }
            } else {
                /* closed */
                if (input_file != NULL)
                    close(inputfd);
                inputfd = -1;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            /* FIXME send close_alert */
            shutdown(sockfd, SHUT_WR);
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && inputfd != -1)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);
    return ret != 0;
}